

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::BlendTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BlendTestInstance *this)

{
  pointer pVVar1;
  TestLog *log;
  TextureFormat TVar2;
  bool bVar3;
  VkResult VVar4;
  deUint32 queueFamilyIndex;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  VkQueue pVVar7;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  TextureFormat tcuColorFormat;
  float local_64c;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  TextureFormat tcuDepthFormat;
  ConstPixelBufferAccess local_620;
  Vector<float,_4> local_5f8;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  ColorVertexShader vertexShader;
  Program program;
  ColorFragmentShader fragmentShader;
  RenderState renderState;
  ReferenceRenderer refRenderer;
  VkSubmitInfo submitInfo;
  
  pDVar5 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar6 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar7 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&this->m_cmdBuffer;
  VVar4 = (*pDVar5->_vptr_DeviceInterface[0x14])(pDVar5,pVVar6,1,&this->m_fence);
  ::vk::checkResult(VVar4,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x310);
  VVar4 = (*pDVar5->_vptr_DeviceInterface[2])
                    (pDVar5,pVVar7,1,&submitInfo,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x311);
  VVar4 = (*pDVar5->_vptr_DeviceInterface[0x16])
                    (pDVar5,pVVar6,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar4,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x312);
  tcuColorFormat = ::vk::mapVkFormat(this->m_colorFormat);
  tcuDepthFormat.order = CHANNELORDER_LAST;
  tcuDepthFormat.type = CHANNELTYPE_LAST;
  ColorVertexShader::ColorVertexShader((ColorVertexShader *)&vertexShader.super_VertexShader);
  ColorFragmentShader::ColorFragmentShader(&fragmentShader,&tcuColorFormat,&tcuDepthFormat);
  program.geometryShader = (GeometryShader *)0x0;
  program.vertexShader = &vertexShader.super_VertexShader;
  program.fragmentShader = &fragmentShader.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &tcuColorFormat,&tcuDepthFormat,&program);
  lVar8 = 0xc0;
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
    ReferenceRenderer::getViewportState(&refRenderer);
    rr::RenderState::RenderState
              (&renderState,(ViewportState *)&local_5e8,VIEWPORTORIENTATION_LOWER_LEFT);
    renderState.fragOps.blendMode = BLENDMODE_STANDARD;
    renderState.fragOps.blendRGBState.srcFunc =
         mapVkBlendFactor((&this->m_blendStates[0].srcColorBlendFactor)[lVar9 * 2]);
    renderState.fragOps.blendRGBState.dstFunc =
         mapVkBlendFactor((&this->m_blendStates[0].dstColorBlendFactor)[lVar9 * 2]);
    renderState.fragOps.blendRGBState.equation =
         mapVkBlendOp((&this->m_blendStates[0].colorBlendOp)[lVar9 * 2]);
    renderState.fragOps.blendAState.srcFunc =
         mapVkBlendFactor((&this->m_blendStates[0].srcAlphaBlendFactor)[lVar9 * 2]);
    renderState.fragOps.blendAState.dstFunc =
         mapVkBlendFactor((&this->m_blendStates[0].dstAlphaBlendFactor)[lVar9 * 2]);
    renderState.fragOps.blendAState.equation =
         mapVkBlendOp((&this->m_blendStates[0].alphaBlendOp)[lVar9 * 2]);
    renderState.fragOps.blendColor.m_data[0] = 0.1;
    renderState.fragOps.blendColor.m_data[1] = 0.2;
    renderState.fragOps.blendColor.m_data[2] = 0.3;
    renderState.fragOps.blendColor.m_data[3] = 0.4;
    mapVkColorComponentFlags
              ((pipeline *)&local_5e8,
               *(VkColorComponentFlags *)
                ((long)&pipeline::(anonymous_namespace)::BlendTest::s_colorWriteMasks + lVar9));
    TVar2 = local_5e8;
    renderState.fragOps.colorMask.m_data[0] = local_5e8._0_1_;
    renderState.fragOps.colorMask.m_data[1] = local_5e8._1_1_;
    renderState.fragOps.colorMask.m_data[2] = local_5e8._2_1_;
    renderState.fragOps.colorMask.m_data[3] = local_5e8._3_1_;
    pVVar1 = (this->m_vertices).
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_5e8 = TVar2;
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_5e8,(Vertex4RGBA *)((long)pVVar1[-6].position.m_data + lVar8),
               (Vertex4RGBA *)((long)(pVVar1->position).m_data + lVar8),(allocator_type *)&local_620
              );
    ReferenceRenderer::draw
              (&refRenderer,&renderState,PRIMITIVETYPE_TRIANGLES,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &local_5e8);
    std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
    ~_Vector_base((_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   *)&local_5e8);
    lVar8 = lVar8 + 0xc0;
  }
  pDVar5 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar6 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar7 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&local_5e8,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)&renderState,pDVar5,pVVar6,
             (VkPhysicalDeviceMemoryProperties *)&local_5e8);
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &local_5e8,pDVar5,pVVar6,pVVar7,queueFamilyIndex,(Allocator *)&renderState,
                      (VkImage)(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)local_5e8;
  local_5e8._0_4_ = (bool  [4])0x0;
  local_5e8._4_4_ = 0.0;
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_5e8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_5e8,0.01);
  switch((ulong)tcuColorFormat >> 0x20) {
  case 0:
  case 3:
    fVar12 = getNormChannelThreshold(&tcuColorFormat,8);
    break;
  case 1:
  case 4:
    fVar12 = getNormChannelThreshold(&tcuColorFormat,0x10);
    break;
  case 2:
  case 6:
    fVar12 = getNormChannelThreshold(&tcuColorFormat,0x20);
    break;
  default:
    goto switchD_004eb42c_caseD_5;
  case 7:
    fVar12 = getNormChannelThreshold(&tcuColorFormat,4);
    local_5e8._4_4_ = getNormChannelThreshold(&tcuColorFormat,4);
    uStack_5e0 = &DAT_3f8000003f800000;
    local_5e8._0_4_ = (bool  [4])fVar12;
    goto switchD_004eb42c_caseD_5;
  case 8:
    fVar10 = getNormChannelThreshold(&tcuColorFormat,5);
    local_64c = getNormChannelThreshold(&tcuColorFormat,6);
    fVar12 = getNormChannelThreshold(&tcuColorFormat,5);
    goto LAB_004eb795;
  case 9:
    fVar10 = getNormChannelThreshold(&tcuColorFormat,5);
    local_64c = getNormChannelThreshold(&tcuColorFormat,5);
    fVar12 = getNormChannelThreshold(&tcuColorFormat,5);
LAB_004eb795:
    local_5e8._4_4_ = local_64c;
    uStack_5e0 = (undefined1 *)CONCAT44(0x3f800000,fVar12);
    local_5e8._0_4_ = (bool  [4])fVar10;
    goto switchD_004eb42c_caseD_5;
  case 10:
    fVar12 = getNormChannelThreshold(&tcuColorFormat,4);
    break;
  case 0xb:
    fVar12 = getNormChannelThreshold(&tcuColorFormat,5);
    fVar10 = getNormChannelThreshold(&tcuColorFormat,5);
    fVar11 = getNormChannelThreshold(&tcuColorFormat,5);
    uStack_5e0 = (undefined1 *)CONCAT44(0x3dcccccd,fVar11);
    local_5e8._0_4_ = (bool  [4])fVar12;
    local_5e8._4_4_ = fVar10;
    goto switchD_004eb42c_caseD_5;
  case 0xe:
  case 0xf:
    fVar12 = getNormChannelThreshold(&tcuColorFormat,10);
    fVar10 = getNormChannelThreshold(&tcuColorFormat,10);
    fVar11 = getNormChannelThreshold(&tcuColorFormat,10);
    uStack_5e0 = (undefined1 *)CONCAT44(0x3eae147b,fVar11);
    local_5e8._0_4_ = (bool  [4])fVar12;
    local_5e8._4_4_ = fVar10;
    goto switchD_004eb42c_caseD_5;
  case 0x16:
    local_620.m_format.order = 0x3ca3d70a;
    local_620.m_format.type = 0x3ca3d70a;
    local_620.m_size.m_data[0] = 0x3d800000;
    local_620.m_size.m_data[1] = 0x3f800000;
    goto LAB_004eb4e5;
  case 0x17:
    local_620.m_format.order = 0x3d4ccccd;
    local_620.m_format.type = 0x3d4ccccd;
    local_620.m_size.m_data[0] = 0x3d4ccccd;
    local_620.m_size.m_data[1] = 0x3f800000;
    goto LAB_004eb4e5;
  case 0x22:
    fVar12 = 0.005;
    break;
  case 0x23:
    fVar12 = 1e-05;
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_620,fVar12);
LAB_004eb4e5:
  uStack_5e0 = (undefined1 *)CONCAT44(local_620.m_size.m_data[1],local_620.m_size.m_data[0]);
  local_5e8._0_4_ = (bool  [4])(float)local_620.m_format.order;
  local_5e8._4_4_ = (float)local_620.m_format.type;
switchD_004eb42c_caseD_5:
  if ((tcuColorFormat.order & ~A) == BGR) {
    local_5f8.m_data[0] = (float)uStack_5e0;
    local_5f8.m_data[1] = local_5e8._4_4_;
    local_5f8.m_data[2] = (float)local_5e8._0_4_;
    local_5f8.m_data[3] = uStack_5e0._4_4_;
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_5f8,(Vector<float,_4> *)&local_5e8);
  }
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)&local_5e8,&refRenderer);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_620,
             result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
             m_data.ptr);
  bVar3 = tcu::floatThresholdCompare
                    (log,"FloatImageCompare","Image comparison",(ConstPixelBufferAccess *)&local_5e8
                     ,&local_620,&local_5f8,COMPARE_LOG_RESULT);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
            (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"Result image matches reference",(allocator<char> *)&local_5e8
              );
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&renderState);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"Image mismatch",(allocator<char> *)&local_5e8);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&renderState);
  }
  std::__cxx11::string::~string((string *)&renderState);
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BlendTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	return verifyImage();
}